

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void ** __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::CreateEmptyTable(InnerMap *this,size_type n)

{
  LogMessage *pLVar1;
  void **__s;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (n < 8) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x394);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: n >= kMinTableSize: ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if ((n & n - 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x395);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (n & (n - 1)) == (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  __s = Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::Alloc<void*>((InnerMap *)this,n);
  memset(__s,0,n << 3);
  return __s;
}

Assistant:

void** CreateEmptyTable(size_type n) {
      GOOGLE_DCHECK(n >= kMinTableSize);
      GOOGLE_DCHECK_EQ(n & (n - 1), 0);
      void** result = Alloc<void*>(n);
      memset(result, 0, n * sizeof(result[0]));
      return result;
    }